

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O0

void dfft_redistribute_cyclic_to_block_1d
               (int *dim,int *pdim,int ndim,int current_dim,int c0,int c1,int *pidx,int rev,
               int size_in,int *embed,cpx_t *work,cpx_t *scratch,int *rho_L,int *rho_pk0,
               int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,int *dfft_offset_recv,
               MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int in_ECX;
  int in_EDX;
  int iVar9;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar10;
  bool bVar11;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  long in_stack_00000050;
  long in_stack_00000058;
  long in_stack_00000060;
  undefined8 in_stack_00000068;
  long in_stack_00000070;
  int in_stack_00000078;
  int k_3;
  int j_1;
  int j0_remote_1;
  int del;
  int j1_offset_1;
  int j1_1;
  int r;
  int j;
  int n;
  int j1_offset;
  int rank_1;
  int k_2;
  int destproc_1;
  int i_1;
  int rank;
  int k_1;
  int destproc;
  int j1;
  int recv;
  int send;
  int j2_new_remote;
  int j0_new_remote;
  int j2_remote;
  int j0_remote;
  int i;
  int k;
  int pdim_tot;
  int j2_new_local;
  int j0_new_local;
  int j2_local;
  int j0_local;
  int send_size;
  int recv_size;
  int offset;
  int p;
  int s;
  int stride;
  int npackets;
  int size;
  int length;
  int local_120;
  int local_11c;
  int local_118;
  int local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b4;
  int local_b0;
  int local_a8;
  int local_a4;
  int local_94;
  int local_90;
  int local_8c;
  int local_84;
  int local_80;
  int local_7c;
  int local_60;
  int local_5c;
  int local_58;
  int local_3c;
  
  if (in_R9D != in_R8D) {
    iVar4 = *(int *)(in_RDI + (long)in_ECX * 4) / *(int *)(in_RSI + (long)in_ECX * 4);
    local_c4 = (iVar4 * in_R9D) / in_R8D;
    if (local_c4 == 0) {
      local_c4 = 1;
    }
    iVar5 = in_stack_00000018 / *(int *)(in_stack_00000020 + (long)in_ECX * 4);
    iVar1 = *(int *)(in_stack_00000008 + (long)in_ECX * 4);
    iVar2 = *(int *)(in_RSI + (long)in_ECX * 4);
    iVar6 = iVar5 * local_c4;
    local_3c = 0;
    iVar7 = iVar1 / in_R9D;
    local_58 = 1;
    for (local_5c = 0; local_5c < in_EDX; local_5c = local_5c + 1) {
      local_58 = *(int *)(in_RSI + (long)local_5c * 4) * local_58;
    }
    for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
      *(undefined4 *)(in_stack_00000048 + (long)local_60 * 4) = 0;
      *(undefined4 *)(in_stack_00000050 + (long)local_60 * 4) = 0;
      *(undefined4 *)(in_stack_00000058 + (long)local_60 * 4) = 0;
      *(undefined4 *)(in_stack_00000060 + (long)local_60 * 4) = 0;
    }
    for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
      iVar9 = local_60 % in_R8D;
      iVar8 = local_60 / in_R9D;
      if ((in_stack_00000010 == 0) || (iVar4 < in_R8D)) {
        bVar10 = iVar8 / (in_R8D / in_R9D) == iVar1 / in_R8D &&
                 (iVar1 % in_R8D) % in_R9D == local_60 % in_R9D;
        bVar11 = iVar7 / (in_R8D / in_R9D) == local_60 / in_R8D && iVar9 % in_R9D == iVar1 % in_R9D;
        if (iVar4 * in_R9D < in_R8D) {
          bVar10 = (iVar1 % in_R8D) / (iVar4 * in_R9D) == iVar8 % (in_R8D / (iVar4 * in_R9D)) &&
                   bVar10;
          bVar11 = iVar9 / (iVar4 * in_R9D) == iVar7 % (in_R8D / (iVar4 * in_R9D)) && bVar11;
        }
      }
      else {
        bVar10 = iVar8 % (iVar2 / in_R8D) ==
                 *(int *)(in_stack_00000040 + (long)(iVar1 / in_R8D) * 4);
        bVar11 = iVar7 % (iVar2 / in_R8D) ==
                 *(int *)(in_stack_00000040 + (long)(local_60 / in_R8D) * 4);
      }
      if (iVar4 * in_R9D < in_R8D) {
        uVar3 = (long)iVar8 / (long)(in_R8D / (iVar4 * in_R9D));
        local_7c = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
                        (long)iVar4);
      }
      else {
        local_7c = ((iVar8 % (in_R8D / in_R9D)) * iVar4 * in_R9D) / in_R8D;
      }
      if (in_stack_00000010 != 0) {
        if (iVar4 < in_R8D) {
          local_7c = *(int *)(in_stack_00000038 + (long)local_7c * 4);
        }
        else {
          local_7c = iVar8 / (iVar2 / in_R8D);
        }
      }
      local_fc = iVar6;
      if (!bVar10) {
        local_fc = 0;
      }
      local_100 = iVar6;
      if (!bVar11) {
        local_100 = 0;
      }
      local_80 = 0;
      if (in_stack_00000078 == 0) {
        for (local_84 = 0; local_84 < in_EDX; local_84 = local_84 + 1) {
          if (in_ECX == local_84) {
            local_108 = local_60;
          }
          else {
            local_108 = *(int *)(in_stack_00000008 + (long)local_84 * 4);
          }
          local_80 = local_108 + *(int *)(in_RSI + (long)local_84 * 4) * local_80;
        }
      }
      else {
        for (local_84 = in_EDX + -1; -1 < local_84; local_84 = local_84 + -1) {
          if (in_ECX == local_84) {
            local_104 = local_60;
          }
          else {
            local_104 = *(int *)(in_stack_00000008 + (long)local_84 * 4);
          }
          local_80 = local_104 + *(int *)(in_RSI + (long)local_84 * 4) * local_80;
        }
      }
      iVar8 = *(int *)(in_stack_00000070 + (long)local_80 * 4);
      if (bVar10) {
        local_110 = iVar5 * local_7c * 8;
      }
      else {
        local_110 = 0;
      }
      *(int *)(in_stack_00000058 + (long)iVar8 * 4) = local_110;
      if ((in_stack_00000010 == 0) || (iVar4 <= in_R8D / in_R9D)) {
        *(int *)(in_stack_00000060 + (long)iVar8 * 4) = local_3c << 3;
      }
      else {
        *(int *)(in_stack_00000060 + (long)iVar8 * 4) = (iVar5 * iVar9 * iVar4) / in_R8D << 3;
      }
      *(int *)(in_stack_00000048 + (long)iVar8 * 4) = local_fc << 3;
      *(int *)(in_stack_00000050 + (long)iVar8 * 4) = local_100 << 3;
      local_118 = iVar6;
      if (!bVar11) {
        local_118 = 0;
      }
      local_3c = local_118 + local_3c;
    }
    if ((in_stack_00000010 == 0) || (iVar6 <= iVar5)) {
      MPI_Barrier(in_stack_00000068);
      MPI_Alltoallv(in_stack_00000028,in_stack_00000048,in_stack_00000058,&ompi_mpi_byte,
                    in_stack_00000030,in_stack_00000050,in_stack_00000060,&ompi_mpi_byte,
                    in_stack_00000068);
      for (local_a8 = 0; local_a8 < iVar4 / local_c4; local_a8 = local_a8 + 1) {
        local_b0 = iVar1 % in_R9D + local_a8 * in_R9D;
        if ((in_stack_00000010 == 0) || (iVar4 < in_R8D)) {
          local_b0 = local_b0 / in_R9D;
          local_b4 = in_R8D / in_R9D;
        }
        else {
          local_b0 = (local_b0 * iVar4) / in_R8D;
          local_b4 = 1;
        }
        for (local_bc = 0; local_bc < iVar6 / iVar5; local_bc = local_bc + 1) {
          for (local_c0 = 0; local_c0 < iVar5; local_c0 = local_c0 + 1) {
            *(undefined8 *)
             (in_stack_00000028 + (long)((local_b0 + local_bc * local_b4) * iVar5 + local_c0) * 8) =
                 *(undefined8 *)
                  (in_stack_00000030 + (long)(local_a8 * iVar6 + local_bc * iVar5 + local_c0) * 8);
          }
        }
      }
    }
    else {
      local_3c = 0;
      for (local_8c = 0; local_8c < iVar2; local_8c = local_8c + 1) {
        local_90 = 0;
        if (in_stack_00000078 == 0) {
          for (local_94 = 0; local_94 < in_EDX; local_94 = local_94 + 1) {
            if (in_ECX == local_94) {
              local_120 = local_8c;
            }
            else {
              local_120 = *(int *)(in_stack_00000008 + (long)local_94 * 4);
            }
            local_90 = local_120 + *(int *)(in_RSI + (long)local_94 * 4) * local_90;
          }
        }
        else {
          for (local_94 = in_EDX + -1; -1 < local_94; local_94 = local_94 + -1) {
            if (in_ECX == local_94) {
              local_11c = local_8c;
            }
            else {
              local_11c = *(int *)(in_stack_00000008 + (long)local_94 * 4);
            }
            local_90 = local_11c + *(int *)(in_RSI + (long)local_94 * 4) * local_90;
          }
        }
        iVar4 = *(int *)(in_stack_00000070 + (long)local_90 * 4);
        iVar1 = *(int *)(in_stack_00000058 + (long)iVar4 * 4);
        *(int *)(in_stack_00000058 + (long)iVar4 * 4) = local_3c * 8 * iVar5;
        iVar4 = (int)((ulong)(long)(*(int *)(in_stack_00000048 + (long)iVar4 * 4) / iVar5) >> 3);
        for (local_a4 = 0; local_a4 < iVar4; local_a4 = local_a4 + 1) {
          for (local_94 = 0; local_94 < iVar5; local_94 = local_94 + 1) {
            *(undefined8 *)
             (in_stack_00000030 + (long)((local_3c + local_a4) * iVar5 + local_94) * 8) =
                 *(undefined8 *)
                  (in_stack_00000028 +
                  (long)(((int)(((ulong)(long)iVar1 >> 3) / (ulong)(long)iVar5) + local_a4 * in_R8D)
                         * iVar5 + local_94) * 8);
          }
        }
        local_3c = iVar4 + local_3c;
      }
      MPI_Barrier(in_stack_00000068);
      MPI_Alltoallv(in_stack_00000030,in_stack_00000048,in_stack_00000058,&ompi_mpi_byte,
                    in_stack_00000028,in_stack_00000050,in_stack_00000060,&ompi_mpi_byte,
                    in_stack_00000068);
    }
  }
  return;
}

Assistant:

void dfft_redistribute_cyclic_to_block_1d(int *dim,
                     int *pdim,
                     int ndim,
                     int current_dim,
                     int c0,
                     int c1,
                     int* pidx,
                     int rev,
                     int size_in,
                     int *embed,
                     cpx_t *work,
                     cpx_t *scratch,
                     int *rho_L,
                     int *rho_pk0,
                     int *dfft_nsend,
                     int *dfft_nrecv,
                     int *dfft_offset_send,
                     int *dfft_offset_recv,
                     MPI_Comm comm,
                     int *proc_map,
                     int row_m)
    {
    if (c1 == c0) return;

    /* length along current dimension */
    int length = dim[current_dim]/pdim[current_dim];
    int size = length*c1/c0;
    size = (size ? size : 1);
    int npackets = length/size;

    int stride = size_in/embed[current_dim];

    /* processor index along current dimension */
    int s=pidx[current_dim];
    /* number of procs along current dimension */
    int p=pdim[current_dim];

    size *= stride;

    int offset = 0;
    int recv_size,send_size;
    int j0_local = s%c0;
    int j2_local = s/c0;
    int j0_new_local = s%c1;
    int j2_new_local = s/c1;

    int pdim_tot=1;
    int k;
    for (k = 0; k < ndim; ++k)
        pdim_tot *= pdim[k];

    int i;
    for (i = 0; i < pdim_tot; ++i)
        {
        dfft_nsend[i] = 0;
        dfft_nrecv[i] = 0;
        dfft_offset_send[i] = 0;
        dfft_offset_recv[i] = 0;
        }

    for (i = 0; i < p; ++i)
        {
        int j0_remote = i%c0;
        int j2_remote = i/c0;

        int j0_new_remote = i % c1;
        int j2_new_remote = i/c1;

        /* decision to send and/or receive */
        int send = 0;
        int recv = 0;
        if (rev && (length >= c0))
            {
            /* redistribute into block with reversed processor id
               and swapped-partially reversed local order (the c0 LSB
               of the local index are MSB, and the n/p/c0 MSB
               are LSB and are reversed */
            send = (((j2_new_remote % (p/c0)) == (rho_pk0[j2_local])) ? 1 : 0);
            recv = (((j2_new_local % (p/c0)) == (rho_pk0[j2_remote])) ? 1 : 0);
            }
        else
            {
            send = (((j2_new_remote / (c0/c1)) == j2_local) && ((j0_local % c1)==j0_new_remote) ? 1 : 0); 
            recv = (((j2_new_local / (c0/c1)) == j2_remote) &&  ((j0_remote % c1)==j0_new_local) ? 1 : 0);

            if (length*c1 < c0)
                {
                send &= (j0_local/(length*c1) == j2_new_remote % (c0/(length*c1)));
                recv &= (j0_remote/(length*c1) == j2_new_local % (c0/(length*c1)));
                }
            }

        /* offset of first element sent */
        int j1;
        if (length*c1 >= c0)
            {
            j1 = (j2_new_remote % (c0/c1))*length*c1/c0;
            }
        else
            {
            j1 = (j2_new_remote / (c0/(length*c1))) % length;
            }

        if (rev)
            {
            if (length >= c0)
                {
                j1 = j2_new_remote/(p/c0);
                }
            else
                j1 = rho_L[j1];
            }

        /* mirror remote decision to send */
        send_size = (send ? size : 0);
        recv_size = (recv ? size : 0);

        int destproc = 0;
        int k;
        if (row_m)
            {
            for (k = ndim-1; k >=0 ;--k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? i : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? i : pidx[k]);
                }
            }

        int rank = proc_map[destproc];

        dfft_offset_send[rank] = (send ? (stride*j1*sizeof(cpx_t)) : 0);
        if (rev && (length > c0/c1))
            {
            /* we are directly receving into the work buf */
            dfft_offset_recv[rank] = stride*j0_remote*length/c0*sizeof(cpx_t);
            }
        else
            {
            dfft_offset_recv[rank] = offset*sizeof(cpx_t);
            }

        dfft_nsend[rank] = send_size*sizeof(cpx_t);
        dfft_nrecv[rank] = recv_size*sizeof(cpx_t);
        offset += (recv ? size : 0);
        }

    /* we need to pack data if the local input buffer is reversed
       and we are sending more than one element */
    if (rev && (size > stride))
        {
        offset = 0;
        /*#pragma omp ... */
        int i;
        for (i = 0; i <p; ++i)
            {
            int destproc = 0;
            int k;
            if (row_m)
                {
                for (k = ndim-1; k >=0 ;--k)
                    {
                    destproc *= pdim[k];
                    destproc += ((current_dim == k) ? i : pidx[k]);
                    }
                }
            else
                {
                for (k = 0; k < ndim; ++k)
                    {
                    destproc *= pdim[k];
                    destproc += ((current_dim == k) ? i : pidx[k]);
                    }
                }

            int rank = proc_map[destproc];

            int j1_offset = dfft_offset_send[rank]/sizeof(cpx_t)/stride;

            /* we are sending from a tmp buffer/stride */
            dfft_offset_send[rank] = offset*sizeof(cpx_t)*stride;
            int n = dfft_nsend[rank]/stride/sizeof(cpx_t);
            int j;
            for (j = 0; j < n; j++)
                for (k = 0; k < stride; ++ k)
                    scratch[(offset+j)*stride+k] = work[(j1_offset+j*c0)*stride+k];

            offset += n;
            }

        /* perform communication */
        MPI_Barrier(comm);
        MPI_Alltoallv(scratch,dfft_nsend, dfft_offset_send, MPI_BYTE,
                      work, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                      comm);
        }
    else
        {
        /* perform communication */
        MPI_Barrier(comm);
        MPI_Alltoallv(work,dfft_nsend, dfft_offset_send, MPI_BYTE,
                      scratch, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                      comm);

        /* unpack */
        int r;
        #pragma omp parallel for private(r)
        for (r = 0; r < npackets; ++r)
            {
            int j1, j1_offset, del;
            int j0_remote = j0_new_local + r*c1;
            if (rev && (length >= c0))
                {
                j1_offset = j0_remote*length/c0;
                del = 1;
                }
            else
                {
                j1_offset = j0_remote/c1;
                del = c0/c1;
                }
            int j;
            for (j = 0; j < (size/stride); ++j)
                {
                j1 = j1_offset + j*del;
                int k;
                for (k = 0; k < stride; ++k)
                    work[j1*stride+k] = scratch[r*size+j*stride+k];
                }
            }
        }
    }